

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

Integer pnga_pgroup_duplicate(Integer grp)

{
  int iVar1;
  uint n;
  proc_list_t *ppVar2;
  proc_list_t *ppVar3;
  proc_list_t *ppVar4;
  int iVar5;
  Integer IVar6;
  int *piVar7;
  int *pid_list;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  Integer IVar11;
  ulong uVar12;
  
  if ((grp != -1) && (PGRP_LIST[grp].actv == 0)) {
    pnga_error(" Group is not active ",grp);
  }
  piVar7 = &PGRP_LIST->actv;
  uVar8 = 0xffffffffffffffff;
  do {
    iVar1 = *piVar7;
    uVar12 = uVar8 + 1;
    if (iVar1 == 0) break;
    lVar9 = uVar8 + 2;
    piVar7 = piVar7 + 10;
    uVar8 = uVar12;
  } while (lVar9 < _max_global_array);
  uVar12 = -(ulong)(iVar1 != 0) | uVar12;
  if (iVar1 != 0) {
    pnga_error(" Too many process groups ",(long)_max_global_array);
  }
  IVar6 = GAnproc;
  ppVar2 = PGRP_LIST;
  piVar7 = (int *)malloc(GAnproc * 8);
  ppVar2[uVar12].map_proc_list = piVar7;
  PGRP_LIST[uVar12].inv_map_proc_list = PGRP_LIST[uVar12].map_proc_list + IVar6;
  ppVar2 = PGRP_LIST + uVar12;
  lVar9 = 0;
  IVar11 = IVar6;
  if (IVar6 < 1) {
    IVar11 = lVar9;
  }
  for (; IVar11 != lVar9; lVar9 = lVar9 + 1) {
    ppVar2->map_proc_list[lVar9] = -1;
  }
  ppVar2 = PGRP_LIST + uVar12;
  for (lVar9 = 0; ppVar4 = PGRP_LIST, IVar11 != lVar9; lVar9 = lVar9 + 1) {
    ppVar2->inv_map_proc_list[lVar9] = -1;
  }
  if (grp == -1) {
    ppVar2 = PGRP_LIST + uVar12;
    for (lVar9 = 0; IVar11 != lVar9; lVar9 = lVar9 + 1) {
      ppVar2->map_proc_list[lVar9] = (int)lVar9;
      ppVar4[uVar12].inv_map_proc_list[lVar9] = (int)lVar9;
    }
  }
  else {
    ppVar2 = PGRP_LIST + grp;
    ppVar3 = PGRP_LIST + uVar12;
    for (lVar9 = 0; IVar11 != lVar9; lVar9 = lVar9 + 1) {
      ppVar3->map_proc_list[lVar9] = ppVar2->map_proc_list[lVar9];
      ppVar4[uVar12].inv_map_proc_list[lVar9] = ppVar4[grp].inv_map_proc_list[lVar9];
    }
  }
  ppVar2 = PGRP_LIST;
  ppVar4 = PGRP_LIST + grp;
  n = ppVar4->map_nproc;
  pid_list = (int *)malloc(IVar6 * 4);
  iVar5 = GA_Default_Proc_Group;
  piVar7 = ppVar2[grp].inv_map_proc_list;
  iVar1 = ppVar2[grp].parent;
  GA_Default_Proc_Group = iVar1;
  if (iVar1 == -1 || grp == -1) {
    if (grp == -1 || iVar1 != -1) {
      for (lVar9 = 0; IVar11 != lVar9; lVar9 = lVar9 + 1) {
        pid_list[lVar9] = (int)lVar9;
      }
    }
    else {
      uVar10 = 0;
      uVar8 = 0;
      if (0 < (int)n) {
        uVar8 = (ulong)n;
      }
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        pid_list[uVar10] = ppVar2[grp].map_proc_list[piVar7[uVar10]];
      }
    }
  }
  else {
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)n) {
      uVar10 = (ulong)n;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      pid_list[uVar8] = ppVar2[iVar1].map_proc_list[piVar7[uVar8]];
    }
  }
  ppVar2 = ppVar2 + uVar12;
  ppVar2->map_nproc = n;
  ppVar2->actv = 1;
  ppVar2->parent = iVar1;
  ppVar2->mirrored = 0;
  ppVar2->map_nproc = ppVar4->map_nproc;
  ARMCI_Group_create(n,pid_list,&ppVar2->group);
  GA_Default_Proc_Group = iVar5;
  free(pid_list);
  return uVar12;
}

Assistant:

Integer pnga_pgroup_duplicate(Integer grp)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    int tmp_count;
    int *tmp_list, *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
    Integer save_grp;
    if (grp != -1 && !PGRP_LIST[grp].actv) {
       pnga_error(" Group is not active ", grp);
    }

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    if (grp != -1) {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = PGRP_LIST[grp].map_proc_list[i];
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = PGRP_LIST[grp].inv_map_proc_list[i];
      }
    } else {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = i;
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = i;
      }
    }
    tmp_count = PGRP_LIST[grp].map_nproc;

    tmp_list = (int*)malloc(GAnproc*sizeof(int));
    tmp2_list = PGRP_LIST[grp].inv_map_proc_list;
    save_grp = GA_Default_Proc_Group;
    GA_Default_Proc_Group = PGRP_LIST[grp].parent;
    if (grp != -1 && GA_Default_Proc_Group != -1) {
       int parent = GA_Default_Proc_Group;
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].map_proc_list[tmp2_list[i]];
       }
    } else if (grp != -1 && GA_Default_Proc_Group == -1) {
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[grp].map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<GAnproc; i++) {
          tmp_list[i] = i;
       }
    }
    
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = PGRP_LIST[grp].parent;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = PGRP_LIST[grp].map_nproc;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp_list, &PGRP_LIST[pgrp_handle].group);
#endif

    GA_Default_Proc_Group = save_grp;
    /* Clean up temporary arrays */
    free(tmp_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}